

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

uint luai_makeseed(void)

{
  uint uVar1;
  time_t tVar2;
  uint *puVar3;
  long lVar4;
  uint buff [4];
  
  puVar3 = buff;
  tVar2 = time((time_t *)0x0);
  buff[2] = (int)tVar2;
  buff[3] = (int)((ulong)tVar2 >> 0x20);
  for (lVar4 = 1; uVar1 = (uint)puVar3, lVar4 != 4; lVar4 = lVar4 + 1) {
    puVar3 = (uint *)(ulong)(uVar1 ^ uVar1 * 0x80 + ((uint)((ulong)puVar3 >> 3) & 0x1fffffff) +
                                     buff[lVar4]);
  }
  return uVar1;
}

Assistant:

static unsigned int luai_makeseed (void) {
  unsigned int buff[BUFSEED];
  unsigned int res;
  unsigned int i;
  time_t t = time(NULL);
  char *b = (char*)buff;
  addbuff(b, b);  /* local variable's address */
  addbuff(b, t);  /* time */
  /* fill (rare but possible) remain of the buffer with zeros */
  memset(b, 0, sizeof(buff) - BUFSEEDB);
  res = buff[0];
  for (i = 1; i < BUFSEED; i++)
    res ^= (res >> 3) + (res << 7) + buff[i];
  return res;
}